

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O0

void __thiscall hypermind::CompileUnit::CompileUnit(CompileUnit *this,VM *mVm,Compiler *compiler)

{
  Signature *local_40;
  Upvalue *local_28;
  Compiler *compiler_local;
  VM *mVm_local;
  CompileUnit *this_local;
  
  this->mVM = mVm;
  this->mScopeDepth = -1;
  local_28 = this->mUpvalues;
  do {
    local_28->isDirectOuterLocalVar = false;
    local_28->index = 0;
    local_28 = local_28 + 1;
  } while (local_28 != (Upvalue *)&this->field_0x40c);
  local_40 = &this->mLocalVariables[0].signature;
  do {
    memset(local_40,0,0x18);
    Signature::Signature(local_40);
    local_40[1].length = 0;
    *(undefined1 *)&local_40[1].hash = 0;
    local_40 = (Signature *)&local_40[1].name;
  } while (local_40 != (Signature *)&this->mLocalVarNumber);
  this->mLocalVarNumber = 0;
  this->mStackSlotNum = 0;
  this->mFn = (HMFunction *)0x0;
  this->mOuter = (CompileUnit *)0x0;
  this->mCurCompiler = compiler;
  this->mCurClassInfo = (ClassInfo *)0x0;
  this->mCurBlockInfo = (BlockInfo *)0x0;
  Buffer<unsigned_int>::Buffer(&this->mLables);
  this->mLine = 0;
  this->mColumn = 0;
  return;
}

Assistant:

explicit CompileUnit(VM *mVm, Compiler *compiler) : mVM(mVm), mCurCompiler(compiler) {}